

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall
Area::Area(Area *this,Vector3f *corner,Vector3f *sideOne,Vector3f *sideTwo,Material *m)

{
  Vector3f local_48 [2];
  Material *local_30;
  Material *m_local;
  Vector3f *sideTwo_local;
  Vector3f *sideOne_local;
  Vector3f *corner_local;
  Area *this_local;
  
  local_30 = m;
  m_local = (Material *)sideTwo;
  sideTwo_local = sideOne;
  sideOne_local = corner;
  corner_local = (Vector3f *)this;
  Object3D::Object3D(&this->super_Object3D,m);
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Area_00170a30;
  Vector3f::Vector3f(&this->_corner,sideOne_local);
  Vector3f::Vector3f(&this->_sideOne,sideTwo_local);
  Vector3f::Vector3f(&this->_sideTwo,&m_local->_diffuseColor);
  Vector3f::cross(local_48,sideTwo_local,&m_local->_diffuseColor);
  Vector3f::normalized(&this->_normal);
  return;
}

Assistant:

Area(Vector3f &corner,
         Vector3f &sideOne,
         Vector3f &sideTwo,
         Material *m) : Object3D(m), _corner(corner),
                        _sideOne(sideOne), _sideTwo(sideTwo),
                        _normal(Vector3f::cross(sideOne,
                                                sideTwo).normalized()) {

    }